

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void * ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *ws,size_t bytes)

{
  ZSTD_cwksp *pZVar1;
  long in_RSI;
  long in_RDI;
  void *bottom;
  void *alloc;
  ZSTD_cwksp *local_8;
  
  local_8 = (ZSTD_cwksp *)(*(long *)(in_RDI + 0x28) - in_RSI);
  pZVar1 = *(ZSTD_cwksp **)(in_RDI + 0x18);
  ZSTD_cwksp_assert_internal_consistency(local_8);
  if (pZVar1 <= local_8) {
    if (local_8 < pZVar1) {
      *(undefined1 *)(in_RDI + 0x38) = 1;
      local_8 = (ZSTD_cwksp *)0x0;
    }
    else {
      if (local_8 < *(ZSTD_cwksp **)(in_RDI + 0x20)) {
        *(ZSTD_cwksp **)(in_RDI + 0x20) = local_8;
      }
      *(ZSTD_cwksp **)(in_RDI + 0x28) = local_8;
    }
    return local_8;
  }
  __assert_fail("alloc >= bottom",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x41cf,"void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)"
               );
}

Assistant:

MEM_STATIC void*
ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp* ws, size_t const bytes)
{
    void* const alloc = (BYTE*)ws->allocStart - bytes;
    void* const bottom = ws->tableEnd;
    DEBUGLOG(5, "cwksp: reserving %p %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(alloc >= bottom);
    if (alloc < bottom) {
        DEBUGLOG(4, "cwksp: alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    /* the area is reserved from the end of wksp.
     * If it overlaps with tableValidEnd, it voids guarantees on values' range */
    if (alloc < ws->tableValidEnd) {
        ws->tableValidEnd = alloc;
    }
    ws->allocStart = alloc;
    return alloc;
}